

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O0

void __thiscall Am_Value_List::Set(Am_Value_List *this,Am_Generic_Procedure *value,bool unique)

{
  undefined1 local_30 [8];
  Am_Value store;
  bool unique_local;
  Am_Generic_Procedure *value_local;
  Am_Value_List *this_local;
  
  store.value.long_value._7_1_ = unique;
  if ((this->data != (Am_Value_List_Data *)0x0) && (unique)) {
    Am_Value_List_Data::Make_Unique(this->data,&this->data,&this->item);
  }
  Am_Value::Am_Value((Am_Value *)local_30,value);
  Am_Value_List_Data::Set(this->data,(Am_Value *)local_30,this->item);
  Am_Value::~Am_Value((Am_Value *)local_30);
  return;
}

Assistant:

void Am_Value_List::Set(const Am_Value &value, bool unique)
{
  if (data) {
    if (unique)
      data->Make_Unique(data, item);
  }
  data->Set(value, item);
}